

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_vli_modSub(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ('\0' < num_words) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar1 = right[uVar3] + uVar2;
      uVar4 = (ulong)(left[uVar3] < uVar1);
      if (uVar1 == 0) {
        uVar4 = uVar2;
      }
      result[uVar3] = left[uVar3] - uVar1;
      uVar3 = uVar3 + 1;
      uVar2 = uVar4;
    } while ((byte)num_words != uVar3);
    if (uVar4 != 0) {
      uVar3 = 0;
      uVar2 = 0;
      do {
        uVar4 = result[uVar3];
        uVar1 = uVar4 + uVar2 + mod[uVar3];
        if (uVar1 != uVar4) {
          uVar2 = (ulong)(uVar1 < uVar4);
        }
        result[uVar3] = uVar1;
        uVar3 = uVar3 + 1;
      } while ((byte)num_words != uVar3);
    }
  }
  return;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_sub(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t borrow = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t diff = left[i] - right[i] - borrow;
        if (diff != left[i]) {
            borrow = (diff > left[i]);
        }
        result[i] = diff;
    }
    return borrow;
}